

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  ViewPlane *pVVar2;
  float *pfVar3;
  Vector3 *pVVar4;
  rep rVar5;
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  *this;
  size_type sVar6;
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  *this_00;
  vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  *this_01;
  vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  *this_02;
  pointer frame_00;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1f0;
  duration<long,_std::ratio<1L,_1000L>_> local_1e8;
  rep local_1e0;
  __uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_> local_1d8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1d0;
  duration<long,_std::ratio<1L,_1000L>_> local_1c8;
  rep local_1c0;
  uint local_1b4;
  pointer pRStack_1b0;
  uint i_1;
  reference_wrapper<pm::PinHole> local_1a8;
  reference_wrapper<pm::GlobalTrace> local_1a0;
  reference_wrapper<pm::World> local_198;
  uint local_18c;
  _Head_base<0UL,_pm::RGBColor_*,_false> _Stack_188;
  uint i;
  duration<long,_std::ratio<1L,_1000000000L>_> local_180;
  duration<long,_std::ratio<1L,_1000L>_> local_178;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_170;
  time_point endTime;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_148 [4];
  uint numThreads;
  PinHole camera;
  GlobalTrace tracer;
  undefined1 local_c8 [8];
  World world;
  unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_> frame;
  time_point startTime;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Poor Man\'s Tracer \n\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Setting up the scene...\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  frame._M_t.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
  super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
  super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       std::chrono::_V2::system_clock::now();
  std::make_unique<pm::RGBColor[]>
            ((size_t)&world.samplers_.
                      super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pm::World::World((World *)local_c8);
  pm::GlobalTrace::GlobalTrace((GlobalTrace *)&camera.distance_);
  setupCornellBox((World *)local_c8);
  pVVar2 = pm::World::viewPlane((World *)local_c8);
  pfVar3 = pm::ViewPlane::editPixelSize(pVVar2);
  *pfVar3 = 0.004;
  validateWorld((World *)local_c8);
  pm::PinHole::PinHole((PinHole *)local_148);
  pVVar4 = pm::Camera::editEye((Camera *)local_148);
  pm::Vector3::set(pVVar4,278.0,273.0,-800.0);
  pVVar4 = pm::Camera::editUp((Camera *)local_148);
  pm::Vector3::set(pVVar4,0.0,1.0,0.0);
  pVVar4 = pm::Camera::editLookAt((Camera *)local_148);
  pm::Vector3::set(pVVar4,278.0,273.0,0.0);
  pfVar3 = pm::PinHole::editViewDistance((PinHole *)local_148);
  *pfVar3 = 4.0;
  pm::Camera::computeUvw((Camera *)local_148);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = std::thread::hardware_concurrency();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&endTime);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)&endTime,
             (ulong)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  local_170.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Scene setting time: ");
  local_180.__r =
       (rep)std::chrono::operator-
                      (&local_170,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&frame);
  local_178.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_180);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_178);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar5);
  poVar1 = std::operator<<(poVar1,"ms\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Scene statistics: ");
  this = pm::World::objects((World *)local_c8);
  sVar6 = std::
          vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
          ::size(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar6);
  poVar1 = std::operator<<(poVar1," objects, ");
  this_00 = pm::World::materials((World *)local_c8);
  sVar6 = std::
          vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
          ::size(this_00);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar6);
  poVar1 = std::operator<<(poVar1," materials, ");
  this_01 = pm::World::lights((World *)local_c8);
  sVar6 = std::
          vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
          ::size(this_01);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar6);
  poVar1 = std::operator<<(poVar1," lights, ");
  this_02 = pm::World::samplers((World *)local_c8);
  sVar6 = std::
          vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
          ::size(this_02);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar6);
  poVar1 = std::operator<<(poVar1," samplers\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Rendering started");
  _Stack_188._M_head_impl = (RGBColor *)std::chrono::_V2::system_clock::now();
  frame._M_t.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
  super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
  super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       _Stack_188._M_head_impl;
  poVar1 = std::operator<<((ostream *)&std::cout," with ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  poVar1 = std::operator<<(poVar1," threads...\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  for (local_18c = 0;
      local_18c <
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_18c = local_18c + 1) {
    local_198 = std::ref<pm::World>((World *)local_c8);
    local_1a0 = std::ref<pm::GlobalTrace>((GlobalTrace *)&camera.distance_);
    local_1a8 = std::ref<pm::PinHole>((PinHole *)local_148);
    pRStack_1b0 = std::unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_>::get
                            ((unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_> *)
                             &world.samplers_.
                              super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(int,int,pm::World&,pm::Tracer&,pm::Camera&,pm::RGBColor*),unsigned_int&,unsigned_int_const&,std::reference_wrapper<pm::World>,std::reference_wrapper<pm::GlobalTrace>,std::reference_wrapper<pm::PinHole>,pm::RGBColor*>
              ((vector<std::thread,std::allocator<std::thread>> *)&endTime,threadFunc,&local_18c,
               (uint *)((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&local_198,
               &local_1a0,&local_1a8,&stack0xfffffffffffffe50);
  }
  for (local_1b4 = 0;
      local_1b4 <
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_1b4 = local_1b4 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&endTime,(ulong)local_1b4);
    std::thread::join();
  }
  local_1c0 = std::chrono::_V2::system_clock::now();
  local_170.__d.__r = (duration)(duration)local_1c0;
  std::operator<<((ostream *)&std::cout,"Rendering time: ");
  local_1d0.__r =
       (rep)std::chrono::operator-
                      (&local_170,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&frame);
  local_1c8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_1d0);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1c8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar5);
  poVar1 = std::operator<<(poVar1,"ms\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  local_1d8._M_t.super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
  super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
       (tuple<pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>)
       std::chrono::_V2::system_clock::now();
  frame._M_t.super___uniq_ptr_impl<pm::RGBColor,_std::default_delete<pm::RGBColor[]>_>._M_t.
  super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
  super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl =
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       (__uniq_ptr_data<pm::RGBColor,_std::default_delete<pm::RGBColor[]>,_true,_true>)
       local_1d8._M_t.super__Tuple_impl<0UL,_pm::RGBColor_*,_std::default_delete<pm::RGBColor[]>_>.
       super__Head_base<0UL,_pm::RGBColor_*,_false>._M_head_impl;
  frame_00 = std::unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_>::get
                       ((unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_> *)
                        &world.samplers_.
                         super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar2 = pm::World::viewPlane((World *)local_c8);
  savePbm("image.pbm",frame_00,pVVar2);
  local_1e0 = std::chrono::_V2::system_clock::now();
  local_170.__d.__r = (duration)(duration)local_1e0;
  std::operator<<((ostream *)&std::cout,"File save time: ");
  local_1f0.__r =
       (rep)std::chrono::operator-
                      (&local_170,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&frame);
  local_1e8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_1f0);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1e8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar5);
  poVar1 = std::operator<<(poVar1,"ms\n");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&endTime);
  pm::PinHole::~PinHole((PinHole *)local_148);
  pm::GlobalTrace::~GlobalTrace((GlobalTrace *)&camera.distance_);
  pm::World::~World((World *)local_c8);
  std::unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_>::~unique_ptr
            ((unique_ptr<pm::RGBColor[],_std::default_delete<pm::RGBColor[]>_> *)
             &world.samplers_.
              super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main()
{
	std::cout << "Poor Man's Tracer \n\n" << std::flush;

	std::cout << "Setting up the scene...\n" << std::flush;
	auto startTime = std::chrono::high_resolution_clock::now();

	std::unique_ptr<pm::RGBColor[]> frame = std::make_unique<pm::RGBColor[]>(Width * Height);

	pm::World world;

#if CORNELL_BOX
	pm::GlobalTrace tracer;
	setupCornellBox(world);
#else
	setupWorld(world);
	pm::AreaLighting tracer;
#endif

	world.viewPlane().editPixelSize() = 0.004f;
	validateWorld(world);

	pm::PinHole camera;
#if CORNELL_BOX
	camera.editEye().set(278.0f, 273.0f, -800.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(278.0f, 273.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#else
	camera.editEye().set(0.0f, 2.0f, -8.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(0.0f, 2.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#endif

#if 0
	//pm::Ortographic camera;
	world.viewPlane().setPixelSize(0.005f);

	pm::PinHole camera;
	camera.editEye().set(0.0f, 1.0f, -5.0f);
	camera.editUp().set(0.0f, 1.0f, 0.0f);
	camera.editLookAt().set(0.0f, 1.0f, 0.0f);
	camera.editViewDistance() = 4.0f;
	camera.computeUvw();
#endif

	const unsigned int numThreads = std::thread::hardware_concurrency();
	std::vector<std::thread> threads;
	threads.reserve(numThreads);

	auto endTime = std::chrono::high_resolution_clock::now();
	std::cout << "Scene setting time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	std::cout << "Scene statistics: " << world.objects().size() << " objects, " << world.materials().size() << " materials, " <<
	             world.lights().size() << " lights, " << world.samplers().size() << " samplers\n" << std::flush;

	std::cout << "Rendering started";
	startTime = std::chrono::high_resolution_clock::now();

#if THREADING_TYPE == 0
	std::cout << " with one thread...\n" << std::flush;
	camera.renderScene(world, tracer, frame.get());
#elif THREADING_TYPE == 1
	std::cout << " with one thread (tiled)...\n" << std::flush;
	for (int i = 0; i < height; i += tileSize)
		for (int j = 0; j < width; j += tileSize)
			camera.renderScene(world, tracer, frame.get(), j, i, tileSize);
#elif THREADING_TYPE == 2
	std::cout << " with " << numThreads << " threads...\n" << std::flush;
	for (unsigned int i = 0; i < numThreads; i++)
		threads.emplace_back(threadFunc, i, numThreads, std::ref(world), std::ref(tracer), std::ref(camera), frame.get());
	for (unsigned int i = 0; i < numThreads; i++)
		threads[i].join();
#endif

	endTime = std::chrono::high_resolution_clock::now();
	std::cout << "Rendering time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	// Save output to PBM binary or ascii format
	startTime = std::chrono::high_resolution_clock::now();
	savePbm("image.pbm", frame.get(), world.viewPlane());
	endTime = std::chrono::high_resolution_clock::now();
	std::cout << "File save time: ";
	std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime).count() << "ms\n" << std::flush;

	return EXIT_SUCCESS;
}